

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O2

void __thiscall SigHashTest::RandomScript(SigHashTest *this,CScript *script)

{
  int iVar1;
  unsigned_long uVar2;
  int iVar3;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&script->super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58
            );
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  iVar1 = RandomMixin<FastRandomContext>::randrange<int>
                    (&this_00->super_RandomMixin<FastRandomContext>,10);
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  while (iVar3 != 0) {
    uVar2 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&this_00->super_RandomMixin<FastRandomContext>,9);
    CScript::operator<<(script,RandomScript::oplist[uVar2]);
    iVar3 = iVar3 + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RandomScript(CScript &script) {
    static const opcodetype oplist[] = {OP_FALSE, OP_1, OP_2, OP_3, OP_CHECKSIG, OP_IF, OP_VERIF, OP_RETURN, OP_CODESEPARATOR};
    script = CScript();
    int ops = (m_rng.randrange(10));
    for (int i=0; i<ops; i++)
        script << oplist[m_rng.randrange(std::size(oplist))];
}